

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::MILSpec::ListType::Clear(ListType *this)

{
  InternalMetadata *this_00;
  ValueType *this_01;
  Dimension *this_02;
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  uVar1 = uVar1 & 1;
  puVar3 = puVar2;
  if (uVar1 != 0) {
    puVar3 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar3 == (undefined8 *)0x0) && (this_01 = this->type_, this_01 != (ValueType *)0x0)) {
    ValueType::~ValueType(this_01);
    operator_delete(this_01,0x20);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
    puVar2 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
  }
  this->type_ = (ValueType *)0x0;
  if (uVar1 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) && (this_02 = this->length_, this_02 != (Dimension *)0x0)) {
    Dimension::~Dimension(this_02);
    operator_delete(this_02,0x20);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->length_ = (Dimension *)0x0;
  if (uVar1 != 0) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
    return;
  }
  return;
}

Assistant:

void ListType::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.ListType)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  if (GetArenaForAllocation() == nullptr && type_ != nullptr) {
    delete type_;
  }
  type_ = nullptr;
  if (GetArenaForAllocation() == nullptr && length_ != nullptr) {
    delete length_;
  }
  length_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}